

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall
QPDF::updateCache(QPDF *this,QPDFObjGen og,shared_ptr<QPDFObject> *object,
                 qpdf_offset_t end_before_space,qpdf_offset_t end_after_space,bool destroy)

{
  bool bVar1;
  element_type *peVar2;
  pointer pMVar3;
  mapped_type *this_00;
  shared_ptr<QPDFObject> local_80;
  ObjCache local_70;
  mapped_type *local_50;
  mapped_type *cache;
  QPDF *local_3c;
  byte local_31;
  qpdf_offset_t qStack_30;
  bool destroy_local;
  qpdf_offset_t end_after_space_local;
  qpdf_offset_t end_before_space_local;
  shared_ptr<QPDFObject> *object_local;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  local_31 = destroy;
  qStack_30 = end_after_space;
  end_after_space_local = end_before_space;
  end_before_space_local = (qpdf_offset_t)object;
  object_local = (shared_ptr<QPDFObject> *)this;
  this_local = (QPDF *)og;
  peVar2 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      object);
  local_3c = this_local;
  QPDFObject::setObjGen(peVar2,this,(QPDFObjGen)this_local);
  stack0xffffffffffffffbc = this_local;
  bVar1 = isCached(this,(QPDFObjGen)this_local);
  if (bVar1) {
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    local_50 = std::
               map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
               ::operator[](&pMVar3->obj_cache,(key_type *)&this_local);
    peVar2 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )end_before_space_local);
    QPDFObject::move_to(peVar2,&local_50->object,(bool)(local_31 & 1));
    local_50->end_before_space = end_after_space_local;
    local_50->end_after_space = qStack_30;
  }
  else {
    std::shared_ptr<QPDFObject>::shared_ptr
              (&local_80,(shared_ptr<QPDFObject> *)end_before_space_local);
    ObjCache::ObjCache(&local_70,&local_80,end_after_space_local,qStack_30);
    pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    this_00 = std::
              map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
              ::operator[](&pMVar3->obj_cache,(key_type *)&this_local);
    ObjCache::operator=(this_00,&local_70);
    ObjCache::~ObjCache(&local_70);
    std::shared_ptr<QPDFObject>::~shared_ptr(&local_80);
  }
  return;
}

Assistant:

void
QPDF::updateCache(
    QPDFObjGen og,
    std::shared_ptr<QPDFObject> const& object,
    qpdf_offset_t end_before_space,
    qpdf_offset_t end_after_space,
    bool destroy)
{
    object->setObjGen(this, og);
    if (isCached(og)) {
        auto& cache = m->obj_cache[og];
        object->move_to(cache.object, destroy);
        cache.end_before_space = end_before_space;
        cache.end_after_space = end_after_space;
    } else {
        m->obj_cache[og] = ObjCache(object, end_before_space, end_after_space);
    }
}